

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

bool __thiscall DnsStats::LoadPcapFiles(DnsStats *this,size_t nb_files,char **fileNames)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  
  if (nb_files == 0) {
    return true;
  }
  uVar2 = 1;
  do {
    bVar1 = LoadPcapFile(this,fileNames[uVar2 - 1]);
    if (!bVar1) {
      return bVar1;
    }
    bVar3 = uVar2 < nb_files;
    uVar2 = uVar2 + 1;
  } while (bVar3);
  return bVar1;
}

Assistant:

bool DnsStats::LoadPcapFiles(size_t nb_files, char const ** fileNames)
{
    bool ret = true;

    for (size_t i = 0; ret && i < nb_files; i++)
    {
        ret = LoadPcapFile(fileNames[i]);
    }

    return ret;
}